

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_bag<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  vector<float,_std::allocator<float>_> *this;
  polyprediction *this_00;
  uint uVar2;
  pointer ppeVar3;
  example *peVar4;
  pointer pfVar5;
  iterator __position;
  float *pfVar6;
  action_score *paVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint32_t uVar13;
  ulong uVar14;
  v_array<ACTION_SCORE::action_score> *__range3;
  int iVar15;
  action_score local_68;
  action_score *local_60;
  multi_ex *local_58;
  ulong local_50;
  multi_learner *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  peVar4 = *ppeVar3;
  this_00 = &peVar4->pred;
  uVar14 = (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3;
  iVar15 = (int)uVar14;
  local_58 = examples;
  local_48 = base;
  if (iVar15 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)&this_00->scalars);
    return;
  }
  pfVar5 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar5) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar5;
  }
  iVar15 = iVar15 + (uint)(iVar15 == 0);
  do {
    local_68 = (action_score)((ulong)local_68 & 0xffffffff00000000);
    __position._M_current =
         (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&data->scores,__position,(float *)&local_68);
    }
    else {
      *__position._M_current = 0.0;
      ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  this = &data->top_actions;
  local_50 = uVar14 & 0xffffffff;
  local_68 = (action_score)((ulong)local_68 & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (this,local_50,(value_type_conflict4 *)&local_68);
  test_adf_sequence(local_58);
  if (data->bag_size != 0) {
    uVar14 = 0;
    do {
      LEARNER::multiline_learn_or_predict<false>(local_48,local_58,data->offset,(uint32_t)uVar14);
      pfVar6 = (peVar4->pred).scalars._end;
      for (pfVar8 = (peVar4->pred).scalars._begin; pfVar8 != pfVar6; pfVar8 = pfVar8 + 2) {
        pfVar5 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[(uint)*pfVar8] = pfVar8[1] + pfVar5[(uint)*pfVar8];
      }
      if (data->first_only == false) {
        paVar7 = (peVar4->pred).a_s._begin;
        lVar11 = (long)(peVar4->pred).scalars._end - (long)paVar7;
        if (lVar11 == 0) {
          uVar10 = 0;
        }
        else {
          uVar12 = lVar11 >> 3;
          uVar9 = 1;
          uVar10 = uVar9;
          if (1 < uVar12) {
            do {
              uVar10 = uVar9;
              if ((paVar7[uVar9].score != paVar7->score) ||
                 (NAN(paVar7[uVar9].score) || NAN(paVar7->score))) break;
              uVar9 = uVar9 + 1;
              uVar10 = uVar12;
            } while (uVar12 != uVar9);
          }
        }
        if (uVar10 != 0) {
          uVar9 = 0;
          do {
            uVar2 = (this_00->a_s)._begin[uVar9].action;
            pfVar5 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar5[uVar2] = pfVar5[uVar2] + 1.0 / (float)uVar10;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
      }
      else {
        uVar2 = ((this_00->a_s)._begin)->action;
        pfVar5 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[uVar2] = pfVar5[uVar2] + 1.0;
      }
      uVar14 = (ulong)((uint32_t)uVar14 + 1);
    } while (uVar14 < data->bag_size);
  }
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68.action = 0;
    local_68.score = 0.0;
    do {
      uVar13 = local_68.action;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_68);
      local_68.action = uVar13 + 1;
      local_68.score = 0.0;
    } while ((ulong)local_68 <
             (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::
  generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
            ((data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_68,&local_40);
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,1,&local_68,&local_40);
  do_sort(data);
  if (local_50 != 0) {
    uVar14 = 0;
    do {
      (this_00->a_s)._begin[uVar14] = (data->action_probs)._begin[uVar14];
      uVar14 = uVar14 + 1;
    } while (local_50 != uVar14);
  }
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}